

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void check_throw_error<fmt::v5::system_error>(int error_code,FormatErrorMessage format)

{
  system_error *this;
  string_view message_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  system_error error;
  memory_buffer message;
  system_error local_260 [23];
  
  fmt::v5::system_error::system_error<>(local_260,0,(string_view)ZEXT816(0x24a729));
  this = (system_error *)__cxa_allocate_exception(0x18);
  message_00.size_ = 7;
  message_00.data_ = "test {}";
  fmt::v5::system_error::system_error<char[6]>(this,error_code,message_00,(char (*) [6])0x235fc2);
  __cxa_throw(this,&fmt::v5::system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_throw_error(int error_code, FormatErrorMessage format) {
  fmt::system_error error(0, "");
  try {
    throw Error(error_code, "test {}", "error");
  } catch (const fmt::system_error &e) {
    error = e;
  }
  fmt::memory_buffer message;
  format(message, error_code, "test error");
  EXPECT_EQ(to_string(message), error.what());
  EXPECT_EQ(error_code, error.error_code());
}